

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetMinimumChange(HelicsInput inp,double tolerance,HelicsError *err)

{
  InputObject *pIVar1;
  HelicsInput in_RSI;
  double in_XMM0_Qa;
  InputObject *inpObj;
  HelicsError *in_stack_ffffffffffffffe0;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput(in_RSI,in_stack_ffffffffffffffe0);
  if (pIVar1 != (InputObject *)0x0) {
    helics::Input::setMinimumChange(pIVar1->inputPtr,in_XMM0_Qa);
  }
  return;
}

Assistant:

void helicsInputSetMinimumChange(HelicsInput inp, double tolerance, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    inpObj->inputPtr->setMinimumChange(tolerance);
}